

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int openDirectory(char *zFilename,int *pFd)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  uint *puVar5;
  int iVar6;
  char zDirname [513];
  char local_228 [528];
  
  sqlite3_snprintf(0x200,local_228,"%s",zFilename);
  uVar3 = strlen(local_228);
  uVar1 = (uint)uVar3;
  if (1 < (int)uVar1) {
    do {
      uVar1 = (uint)uVar3;
      if (local_228[uVar3 & 0xffffffff] == '/') goto LAB_00157aa0;
      uVar3 = (ulong)(uVar1 - 1);
    } while (2 < (int)uVar1);
    uVar1 = 1;
  }
LAB_00157aa0:
  if ((int)uVar1 < 1) {
    iVar2 = -1;
  }
  else {
    local_228[uVar1] = '\0';
    do {
      iVar2 = (*aSyscall[0].pCurrent)(local_228,0x80000,0x1a4);
      if (-1 < iVar2) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  *pFd = iVar2;
  iVar6 = 0;
  if (iVar2 < 0) {
    iVar6 = 0xe;
    sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0x67e1,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
    puVar5 = (uint *)__errno_location();
    sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x67e1,(ulong)*puVar5,"open",local_228,"");
  }
  return iVar6;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>1 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
    fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
    if( fd>=0 ){
      OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
    }
  }
  *pFd = fd;
  return (fd>=0?SQLITE_OK:unixLogError(SQLITE_CANTOPEN_BKPT, "open", zDirname));
}